

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo.c
# Opt level: O2

int undo(int f,int n)

{
  anon_enum_32 aVar1;
  uint uVar2;
  buffer *pbVar3;
  undo_rec **ppuVar4;
  line *plVar5;
  list *plVar6;
  int iVar7;
  mgwin *pmVar8;
  int iVar9;
  int iVar10;
  buffer *pbVar11;
  buffer *rec;
  buffer *buf;
  bool bVar12;
  int local_34;
  
  buf = (buffer *)(ulong)(uint)f;
  pbVar11 = (buffer *)(ulong)(uint)n;
  if (n < 0) {
    return 0;
  }
  rec = (buffer *)curbp->b_undoptr;
  if (((undo_nulled & rec == (buffer *)0x0) != 0) || (rptcount == 0)) {
    rec = (buffer *)(curbp->b_undo).tqh_first;
    undo_nulled = 1;
  }
  local_34 = 1;
  do {
    bVar12 = n == 0;
    n = n + -1;
    if (bVar12) {
LAB_00118596:
      curbp->b_undoptr = (undo_rec *)rec;
      return local_34;
    }
    while( true ) {
      if (rec == (buffer *)0x0) {
        dobeep();
        rec = (buffer *)0x0;
        ewprintf("No further undo information");
        undo_nulled = 1;
        local_34 = 0;
        goto LAB_00118596;
      }
      if (*(int *)&rec->b_altb != 3) break;
      pbVar3 = (rec->b_list).l_p.x_bp;
      ppuVar4 = (undo_rec **)(rec->b_list).l_name;
      plVar6 = &pbVar3->b_list;
      if (pbVar3 == (buffer *)0x0) {
        plVar6 = (list *)&curbp->b_undo;
      }
      plVar6->l_name = (char *)ppuVar4;
      *ppuVar4 = (undo_rec *)pbVar3;
      free_undo_record((undo_rec *)rec);
      buf = rec;
      rec = pbVar3;
    }
    undo_nulled = 0;
    undo_add_boundary((int)buf,(int)pbVar11);
    iVar7 = boundary_flag;
    boundary_flag = 0;
    do {
      pmVar8 = curwp;
      aVar1 = *(anon_enum_32 *)&rec->b_altb;
      if (1 < aVar1 - BOUNDARY) {
        pbVar11 = (buffer *)curbp->b_headp;
        iVar10 = 0;
        buf = pbVar11;
        for (iVar9 = *(int *)rec->b_modes; uVar2 = *(int *)((long)&buf->b_altb + 4),
            (int)uVar2 < iVar9; iVar9 = iVar9 + ~uVar2) {
          buf = (buffer *)(buf->b_list).l_p.l_wp;
          if (buf == pbVar11) {
            dobeep();
            local_34 = 0;
            iVar9 = 0x1223b2;
            ewprintf("Internal error in Undo!");
            goto LAB_00118554;
          }
          iVar10 = iVar10 + 1;
        }
        curwp->w_dotp = (line *)buf;
        pmVar8->w_doto = iVar9;
        pmVar8->w_markline = pmVar8->w_dotline;
        pmVar8->w_dotline = iVar10;
        pbVar11 = (buffer *)pmVar8;
      }
      iVar9 = (int)buf;
      switch(aVar1) {
      case INSERT:
        buf = (buffer *)(ulong)*(uint *)&rec->b_headp;
        pbVar11 = (buffer *)0x0;
        ldelete(*(uint *)&rec->b_headp,0);
        break;
      case DELETE:
        plVar5 = curwp->w_dotp;
        iVar9 = curwp->w_doto;
        buf = (buffer *)rec->b_modes[1];
        pbVar11 = (buffer *)(ulong)*(uint *)&rec->b_headp;
        region_put_data((char *)buf,*(uint *)&rec->b_headp);
        pmVar8 = curwp;
        curwp->w_dotp = plVar5;
        pmVar8->w_doto = iVar9;
        break;
      case BOUNDARY:
        rec = (buffer *)(rec->b_list).l_p.l_wp;
        goto LAB_00118554;
      case MODIFIED:
        curbp->b_flag = curbp->b_flag & 0xfe;
        break;
      case DELREG:
        buf = (buffer *)rec->b_modes[1];
        pbVar11 = (buffer *)(ulong)*(uint *)&rec->b_headp;
        region_put_data((char *)buf,*(uint *)&rec->b_headp);
      }
      iVar9 = (int)buf;
      rec = (buffer *)(rec->b_list).l_p.l_wp;
    } while (rec != (buffer *)0x0);
LAB_00118554:
    boundary_flag = iVar7;
    undo_add_boundary(iVar9,(int)pbVar11);
    buf = (buffer *)0x1223c4;
    ewprintf("Undo!");
  } while( true );
}

Assistant:

int
undo(int f, int n)
{
	struct undo_rec	*ptr, *nptr;
	int		 done, rval;
	struct line	*lp;
	int		 offset, save;
	static int	 nulled = FALSE;
	int		 lineno;

	if (n < 0)
		return (FALSE);

	ptr = curbp->b_undoptr;

	/* first invocation, make ptr point back to the top of the list */
	if ((ptr == NULL && nulled == TRUE) ||  rptcount == 0) {
		ptr = TAILQ_FIRST(&curbp->b_undo);
		nulled = TRUE;
	}

	rval = TRUE;
	while (n--) {
		/* if we have a spurious boundary, free it and move on.... */
		while (ptr && ptr->type == BOUNDARY) {
			nptr = TAILQ_NEXT(ptr, next);
			TAILQ_REMOVE(&curbp->b_undo, ptr, next);
			free_undo_record(ptr);
			ptr = nptr;
		}
		/*
		 * Ptr is NULL, but on the next run, it will point to the
		 * top again, redoing all stuff done in the buffer since
		 * its creation.
		 */
		if (ptr == NULL) {
			dobeep();
			ewprintf("No further undo information");
			rval = FALSE;
			nulled = TRUE;
			break;
		}
		nulled = FALSE;

		/*
		 * Loop while we don't get a boundary specifying we've
		 * finished the current action...
		 */

		undo_add_boundary(FFRAND, 1);

		save = boundary_flag;
		boundary_flag = FALSE;

		done = 0;
		do {
			/*
			 * Move to where this has to apply
			 *
			 * Boundaries (and the modified flag)  are put as
			 * position 0 (to save lookup time in find_dot)
			 * so we must not move there...
			 */
			if (ptr->type != BOUNDARY && ptr->type != MODIFIED) {
				if (find_lo(ptr->pos, &lp,
				    &offset, &lineno) == FALSE) {
					dobeep();
					ewprintf("Internal error in Undo!");
					rval = FALSE;
					break;
				}
				curwp->w_dotp = lp;
				curwp->w_doto = offset;
				curwp->w_markline = curwp->w_dotline;
				curwp->w_dotline = lineno;
			}

			/*
			 * Do operation^-1
			 */
			switch (ptr->type) {
			case INSERT:
				ldelete(ptr->region.r_size, KNONE);
				break;
			case DELETE:
				lp = curwp->w_dotp;
				offset = curwp->w_doto;
				region_put_data(ptr->content,
				    ptr->region.r_size);
				curwp->w_dotp = lp;
				curwp->w_doto = offset;
				break;
			case DELREG:
				region_put_data(ptr->content,
				    ptr->region.r_size);
				break;
			case BOUNDARY:
				done = 1;
				break;
			case MODIFIED:
				curbp->b_flag &= ~BFCHG;
				break;
			default:
				break;
			}

			/* And move to next record */
			ptr = TAILQ_NEXT(ptr, next);
		} while (ptr != NULL && !done);

		boundary_flag = save;
		undo_add_boundary(FFRAND, 1);

		ewprintf("Undo!");
	}

	curbp->b_undoptr = ptr;

	return (rval);
}